

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgdata.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  byte mode;
  UErrorCode *pUVar1;
  char verbose;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  UBool UVar9;
  char cVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int32_t iVar14;
  uint32_t uVar15;
  FILE *pFVar16;
  size_t sVar17;
  char *buffer;
  char *pcVar18;
  char *sourcePath;
  char *optEntryPoint;
  FileStream *pFVar19;
  char *pcVar20;
  char *pcVar21;
  size_t sVar22;
  CharList *l;
  char *pcVar23;
  size_t sVar24;
  size_t sVar25;
  char cVar26;
  int32_t i_2;
  uint uVar27;
  char *__src;
  char *pcVar28;
  long lVar29;
  char *pcVar30;
  long lVar31;
  char *pcVar32;
  char *__src_00;
  UBool UVar33;
  char *pcVar34;
  UErrorCode *pUVar35;
  UErrorCode *pUVar36;
  int32_t i;
  int32_t n;
  ulong uVar37;
  char **ppcVar38;
  UErrorCode *pUVar39;
  char *pcVar40;
  char (*pacVar41) [320];
  int32_t i_1;
  char *pcVar42;
  char *pcVar43;
  _CharList *p_Var44;
  char (*pacVar45) [10];
  UBool local_62ec;
  CharList *local_62e0;
  CharList *local_62c8;
  CharList *local_62b8;
  CharList *local_62a8;
  char version_major [10];
  CharList *tail;
  char targetDir [512];
  UErrorCode status_1;
  uint local_6030;
  LocalPipeFilePointer p;
  char newName [512];
  UErrorCode status;
  char gencFilePath [512];
  char dataName [512];
  CharString cmdBuf;
  char datFileName [512];
  char cmd [28];
  char tmpDir [512];
  char dirBuf [1024];
  
  progname = *argv;
  options[2].value = "common";
  uVar11 = u_parseArgs(argc,argv,0x16,options);
  if (options[4].doesOccur != '\0' || options[3].doesOccur != '\0') {
    fprintf(_stderr,
            "usage: %s [-options] [-] [packageFile] \n\tProduce packaged ICU data from the given list(s) of files.\n\t\'-\' by itself means to read from stdin.\n\tpackageFile is a text file containing the list of files to package.\n"
            ,progname);
    fwrite("\n options:\n",0xb,1,_stderr);
    pacVar41 = options_help;
    for (lVar31 = 0; lVar31 != 0x370; lVar31 = lVar31 + 0x28) {
      pcVar42 = "";
      if (lVar31 == 0) {
        pcVar42 = "[REQ]";
      }
      pcVar23 = *(char **)((long)&options[0].longName + lVar31);
      pcVar34 = "or --";
      if (pcVar23 == (char *)0x0) {
        pcVar34 = "     ";
        pcVar23 = "";
      }
      fprintf(_stderr,"%-5s -%c %s%-10s  %s\n",pcVar42,
              (ulong)(uint)(int)(&options[0].shortName)[lVar31],pcVar34,pcVar23,pacVar41);
      pacVar41 = pacVar41 + 1;
    }
    fwrite("modes: (-m option)\n",0x13,1,_stderr);
    for (lVar31 = 0x10; lVar31 != 0x58; lVar31 = lVar31 + 0x18) {
      lVar29 = *(long *)((long)&__do_global_dtors_aux_fini_array_entry + lVar31);
      fprintf(_stderr,"   %-9s ",*(undefined8 *)((long)&__frame_dummy_init_array_entry + lVar31));
      if (lVar29 == 0) {
        fwrite("           ",0xb,1,_stderr);
      }
      else {
        fprintf(_stderr,"/ %-9s",lVar29);
      }
      fprintf(_stderr,"  %s\n",*(undefined8 *)((long)&modes[0].name + lVar31));
    }
    return 1;
  }
  if ((int)uVar11 < 0) {
    fprintf(_stderr,"%s: error in command line argument \"%s\"\n",progname,argv[-uVar11]);
  }
  else {
    if ((options[1].doesOccur == '\0') &&
       (iVar12 = strcmp(options[2].value,"common"), cVar26 = options[5].doesOccur, iVar12 != 0)) {
      p.super_LocalPointerBase<_IO_FILE>.ptr = (LocalPointerBase<_IO_FILE>)(_IO_FILE *)0x0;
      icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&cmdBuf.buffer);
      cmdBuf.len = 0;
      *cmdBuf.buffer.ptr = '\0';
      status = U_ZERO_ERROR;
      builtin_strncpy(cmd + 0x10,"pkgdatafile",0xc);
      builtin_strncpy(cmd,"icu-config --inc",0x10);
      memset(dirBuf,0,0x400);
      findDirname(progname,dirBuf,0x400,&status);
      if (status < U_ILLEGAL_ARGUMENT_ERROR) {
        icu_63::StringPiece::StringPiece((StringPiece *)&status_1,dirBuf);
        icu_63::CharString::append(&cmdBuf,_status_1,local_6030,&status);
        if (*cmdBuf.buffer.ptr != '\0') {
          icu_63::StringPiece::StringPiece((StringPiece *)newName,"/");
          icu_63::CharString::append
                    (&cmdBuf,(char *)CONCAT44(newName._4_4_,newName._0_4_),newName._8_4_,&status);
        }
        icu_63::StringPiece::StringPiece((StringPiece *)dataName,cmd);
        icu_63::CharString::append
                  (&cmdBuf,(char *)CONCAT71(dataName._1_7_,dataName[0]),dataName._8_4_,&status);
        if (cVar26 != '\0') {
          fprintf(_stdout,"# Calling icu-config: %s\n",cmdBuf.buffer.ptr);
        }
        pFVar16 = popen(cmdBuf.buffer.ptr,"r");
        LocalPipeFilePointer::adoptInstead(&p,(FILE *)pFVar16);
      }
      if ((p.super_LocalPointerBase<_IO_FILE>.ptr == (_IO_FILE *)0x0) ||
         (sVar17 = fread(&pkg_getOptionsFromICUConfig(signed,UOption*)::buf,1,0x1ff,
                         (FILE *)p.super_LocalPointerBase<_IO_FILE>.ptr), sVar17 == 0)) {
        if (cVar26 != '\0') {
          fprintf(_stdout,"# Calling icu-config: %s\n",cmd);
        }
        pFVar16 = popen(cmd,"r");
        LocalPipeFilePointer::adoptInstead(&p,(FILE *)pFVar16);
        pcVar42 = "%s: icu-config: No icu-config found. (fix PATH or use -O option)\n";
        if ((p.super_LocalPointerBase<_IO_FILE>.ptr != (_IO_FILE *)0x0) &&
           (sVar17 = fread(&pkg_getOptionsFromICUConfig(signed,UOption*)::buf,1,0x1ff,
                           (FILE *)p.super_LocalPointerBase<_IO_FILE>.ptr), sVar17 != 0))
        goto LAB_001eda7a;
      }
      else {
LAB_001eda7a:
        sVar17 = strlen(&pkg_getOptionsFromICUConfig(signed,UOption*)::buf);
        while( true ) {
          sVar17 = sVar17 - 1;
          if ((int)(uint)sVar17 < 0) break;
          uVar27 = (uint)sVar17 & 0x7fffffff;
          if (((&pkg_getOptionsFromICUConfig(signed,UOption*)::buf)[uVar27] != ' ') &&
             ((&pkg_getOptionsFromICUConfig(signed,UOption*)::buf)[uVar27] != '\n')) break;
          (&pkg_getOptionsFromICUConfig(signed,UOption*)::buf)[uVar27] = 0;
        }
        sVar17 = strlen(&pkg_getOptionsFromICUConfig(signed,UOption*)::buf);
        if (libFileNames[3][sVar17 + 0xff] == '\n') {
          libFileNames[3][sVar17 + 0xff] = '\0';
        }
        if (pkg_getOptionsFromICUConfig(signed,UOption*)::buf != '\0') {
          if (cVar26 != '\0') {
            fprintf(_stdout,"# icu-config said: %s\n",
                    &pkg_getOptionsFromICUConfig(signed,UOption*)::buf);
          }
          options[1].value = &pkg_getOptionsFromICUConfig(signed,UOption*)::buf;
          options[1].doesOccur = '\x01';
          icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&cmdBuf.buffer);
          LocalPipeFilePointer::~LocalPipeFilePointer(&p);
          goto LAB_001edb1d;
        }
        pcVar42 = "%s: icu-config: invalid response from icu-config (fix PATH or use -O option)\n";
      }
      fprintf(_stderr,pcVar42,progname);
      icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&cmdBuf.buffer);
      LocalPipeFilePointer::~LocalPipeFilePointer(&p);
      pcVar42 = " required parameter is missing: -O is required for static and shared builds.\n";
      sVar17 = 0x4d;
    }
    else {
LAB_001edb1d:
      pUVar39 = (UErrorCode *)options[0xe].value;
      pcVar23 = options[2].value;
      pcVar42 = options[0].value;
      if (options[0].doesOccur != '\0') {
        if (uVar11 == 1) {
          pcVar42 = "No input files specified.\nRun \'%s --help\' for help.\n";
          goto LAB_001ee53d;
        }
        pcVar34 = (char *)0x0;
        if (options[0xe].doesOccur != '\0') {
          pcVar34 = options[0xe].value;
        }
        sVar17 = strlen(options[0].value);
        buffer = (char *)uprv_malloc_63((long)((int)sVar17 + 2));
        iVar12 = (int)*pcVar42;
        pcVar40 = buffer;
        if (*pcVar42 != '\0') {
          iVar13 = isalpha(iVar12);
          pcVar28 = buffer;
          pcVar43 = pcVar42;
          while( true ) {
            pcVar43 = pcVar43 + 1;
            pcVar40 = pcVar28 + 1;
            cVar26 = '_';
            if (iVar13 != 0) {
              cVar26 = (char)iVar12;
            }
            *pcVar28 = cVar26;
            iVar12 = (int)*pcVar43;
            if (*pcVar43 == '\0') break;
            iVar13 = isalnum(iVar12);
            pcVar28 = pcVar40;
          }
        }
        *pcVar40 = '\0';
        pcVar40 = pcVar42;
        if (options[0x10].doesOccur != '\0') {
          pcVar40 = options[0x10].value;
        }
        if (options[0x13].doesOccur != '\0') {
          fwrite("Warning: You are using the -z option which only works on z/OS.\n",0x3f,1,_stdout);
        }
        cVar7 = options[0x12].doesOccur;
        cVar6 = options[0xd].doesOccur;
        optEntryPoint = options[0xd].value;
        cVar5 = options[0xc].doesOccur;
        sourcePath = options[0xc].value;
        cVar4 = options[0xb].doesOccur;
        pcVar28 = options[0xb].value;
        cVar3 = options[10].doesOccur;
        __src = options[10].value;
        cVar2 = options[9].doesOccur;
        cVar10 = options[8].doesOccur;
        pcVar32 = options[8].value;
        cVar8 = options[6].doesOccur;
        verbose = options[5].doesOccur;
        cVar26 = options[1].doesOccur;
        pcVar43 = options[1].value;
        pcVar30 = (char *)0x0;
        if (options[7].doesOccur != '\0') {
          pcVar30 = options[7].value;
        }
        local_62b8 = (CharList *)0x0;
        tail = (CharList *)0x0;
        for (uVar37 = 1; uVar37 < uVar11; uVar37 = uVar37 + 1) {
          pcVar18 = uprv_strdup_63(argv[uVar37]);
          local_62b8 = pkg_appendToList(local_62b8,&tail,pcVar18);
        }
        if (cVar26 == '\0') {
          pcVar43 = (char *)0x0;
        }
        pcVar18 = 
        " Copyright (C) 2016 and later: Unicode, Inc. and others. License & terms of use: http://www.unicode.org/copyright.html "
        ;
        if (cVar8 == '\0') {
          pcVar18 = pcVar30;
        }
        if (cVar10 == '\0') {
          pcVar32 = ".";
        }
        if (cVar3 == '\0') {
          __src = pcVar32;
        }
        if (cVar4 == '\0') {
          pcVar28 = (char *)0x0;
        }
        if (cVar5 == '\0') {
          sourcePath = ".";
        }
        if (cVar6 == '\0') {
          optEntryPoint = buffer;
        }
        cmdBuf.buffer.ptr = (char *)0x0;
        cmd[0] = '\0';
        cmd[1] = '\0';
        cmd[2] = '\0';
        cmd[3] = '\0';
        cmd[4] = '\0';
        cmd[5] = '\0';
        cmd[6] = '\0';
        cmd[7] = '\0';
        local_62a8 = (CharList *)0x0;
        l = (CharList *)0x0;
        uVar11 = 0;
        for (p_Var44 = local_62b8; p_Var44 != (CharList *)0x0; p_Var44 = p_Var44->next) {
          if (verbose != '\0') {
            fprintf(_stdout,"# pkgdata: Reading %s..\n",p_Var44->str);
          }
          pFVar19 = T_FileStream_open(p_Var44->str,"r");
          if (pFVar19 == (FileStream *)0x0) {
            fprintf(_stderr,"Error opening <%s>.\n",p_Var44->str);
            pFVar16 = _stderr;
            pcVar42 = u_errorName_63(U_FILE_ACCESS_ERROR);
            fprintf(pFVar16,"error loading input file lists: %s\n",pcVar42);
            return 2;
          }
          while( true ) {
            pcVar30 = tmpDir + 0x1ff;
            pcVar20 = T_FileStream_readLine(pFVar19,dirBuf,0x4000);
            if (pcVar20 == (char *)0x0) break;
            uVar11 = uVar11 + 1;
            sVar17 = strlen(dirBuf);
            pcVar20 = dirBuf;
            if (0x3fac < sVar17) {
              fprintf(_stderr,"%s:%d - line too long (over %d chars)\n",p_Var44->str,(ulong)uVar11,
                      0x3fac);
LAB_001efbe1:
              iVar12 = 1;
LAB_001efbe3:
              exit(iVar12);
            }
            do {
              pcVar20 = pcVar20 + 1;
              cVar26 = pcVar30[1];
              pcVar30 = pcVar30 + 1;
              iVar12 = isspace((int)cVar26);
              cVar8 = cVar26;
            } while (iVar12 != 0);
            while (cVar8 != '\0') {
              if ((cVar8 == '\r') || (cVar8 == '\n')) {
                pcVar20[-1] = '\0';
                cVar26 = *pcVar30;
                break;
              }
              cVar8 = *pcVar20;
              pcVar20 = pcVar20 + 1;
            }
            if ((cVar26 != '\0') && (cVar26 != '#')) {
              while ((pcVar30 != (char *)0x0 &&
                     (cVar26 = *pcVar30, pcVar20 = pcVar30, cVar26 != '\0'))) {
                while (pcVar30 = pcVar20 + 1, cVar26 == ' ') {
                  pcVar20 = pcVar30;
                  cVar26 = *pcVar30;
                }
                if (cVar26 == '\"') {
                  pcVar21 = strchr(pcVar30,0x22);
                  if (pcVar21 == (char *)0x0) {
                    fprintf(_stderr,"%s:%d - missing trailing double quote (\")\n",p_Var44->str,
                            (ulong)uVar11);
                    goto LAB_001efbe1;
                  }
                  pcVar30 = pcVar21 + 1;
                  cVar26 = pcVar21[1];
                  if (cVar26 != '\0') {
                    if (cVar26 != ' ') {
                      fprintf(_stderr,
                              "%s:%d - malformed quoted line at position %d, expected \' \' got \'%c\'\n"
                              ,p_Var44->str,(ulong)uVar11,(ulong)(uint)((int)pcVar30 - (int)dirBuf),
                              (ulong)(uint)(int)cVar26);
                      goto LAB_001efbe1;
                    }
                    pcVar21[1] = '\0';
                    pcVar30 = pcVar21 + 2;
                  }
                }
                else {
                  pcVar30 = strchr(pcVar20,0x20);
                  if (pcVar30 == (char *)0x0) {
                    pcVar30 = (char *)0x0;
                  }
                  else {
                    *pcVar30 = '\0';
                    pcVar30 = pcVar30 + 1;
                  }
                }
                pcVar21 = getLongPathname(pcVar20);
                pcVar20 = uprv_strdup_63(pcVar20);
                local_62a8 = pkg_appendToList(local_62a8,(CharList **)&cmdBuf,pcVar20);
                UVar9 = uprv_pathIsAbsolute_63(pcVar21);
                if ((UVar9 != '\0') || (*pcVar21 == '.')) {
                  fprintf(_stderr,
                          "pkgdata: Error: absolute path encountered. Old style paths are not supported. Use relative paths such as \'fur.res\' or \'translit%cfur.res\'.\n\tBad path: \'%s\'\n"
                          ,0x2f,pcVar21);
                  goto LAB_001efbe1;
                }
                sVar17 = strlen(sourcePath);
                sVar22 = strlen(pcVar21);
                uVar27 = (int)sVar17 + (int)sVar22 + 5;
                pcVar20 = (char *)uprv_malloc_63((long)(int)uVar27);
                if (pcVar20 == (char *)0x0) {
                  fprintf(_stderr,"pkgdata: Error: Unable to allocate tmp buffer size: %d\n",
                          (ulong)uVar27);
                  iVar12 = 7;
                  goto LAB_001efbe3;
                }
                strcpy(pcVar20,sourcePath);
                sVar17 = strlen(sourcePath);
                __src_00 = "/";
                if (sourcePath[sVar17 - 1] == '/') {
                  __src_00 = "";
                }
                strcat(pcVar20,__src_00);
                strcat(pcVar20,pcVar21);
                l = pkg_appendToList(l,(CharList **)cmd,pcVar20);
              }
            }
          }
          T_FileStream_close(pFVar19);
        }
        mode = *pcVar23;
        memset(targetDir,0,0x200);
        memset(tmpDir,0,0x200);
        memset(datFileName,0,0x200);
        memset(&cmdBuf,0,0x800);
        memset(cmd,0,0x800);
        dirBuf[0] = '\0';
        dirBuf[1] = '\0';
        dirBuf[2] = '\0';
        dirBuf[3] = '\0';
        pkgDataFlags = (char **)uprv_malloc_63(0x88);
        iVar12 = 0x200;
        do {
          if (pkgDataFlags == (char **)0x0) {
            fwrite("Error allocating memory for pkgDataFlags.\n",0x2a,1,_stderr);
            break;
          }
          uVar37 = 0;
          ppcVar38 = pkgDataFlags;
LAB_001ee12b:
          if (uVar37 != 0x11) {
            pcVar23 = (char *)uprv_malloc_63((long)iVar12);
            ppcVar38 = pkgDataFlags;
            pkgDataFlags[uVar37] = pcVar23;
            if (pcVar23 != (char *)0x0) goto code_r0x001ee14d;
            fwrite("Error allocating memory for pkgDataFlags.\n",0x2a,1,_stderr);
            ppcVar38 = pkgDataFlags;
            for (; uVar37 < 0x10; uVar37 = uVar37 + 1) {
              ppcVar38[uVar37 + 1] = (char *)0x0;
            }
            break;
          }
          if (pcVar43 == (char *)0x0) break;
          if (verbose != '\0') {
            fprintf(_stdout,"# Reading options file %s\n",pcVar43);
            ppcVar38 = pkgDataFlags;
          }
          dirBuf[0] = '\0';
          dirBuf[1] = '\0';
          dirBuf[2] = '\0';
          dirBuf[3] = '\0';
          iVar14 = parseFlagsFile(pcVar43,ppcVar38,iVar12,FLAG_NAMES,0x11,(UErrorCode *)dirBuf);
          pFVar16 = _stderr;
          if (dirBuf._0_4_ == 0xf) {
            for (lVar31 = 0; iVar12 = iVar14, lVar31 != 0x11; lVar31 = lVar31 + 1) {
              if (pkgDataFlags[lVar31] != (char *)0x0) {
                uprv_free_63(pkgDataFlags[lVar31]);
                pkgDataFlags[lVar31] = (char *)0x0;
              }
            }
          }
          else if (0 < (int)dirBuf._0_4_) {
            pcVar23 = u_errorName_63(dirBuf._0_4_);
            fprintf(pFVar16,"Unable to open or read \"%s\" option file. status = %s\n",pcVar43,
                    pcVar23);
            break;
          }
          if (verbose != '\0') {
            fwrite("# pkgDataFlags=\n",0x10,1,_stdout);
            ppcVar38 = FLAG_NAMES;
            for (uVar37 = 0; uVar37 != 0x11; uVar37 = uVar37 + 1) {
              fprintf(_stdout,"  [%d] %s:  %s\n",uVar37 & 0xffffffff,*ppcVar38);
              ppcVar38 = ppcVar38 + 1;
            }
            fputc(10,_stdout);
          }
        } while (dirBuf._0_4_ == 0xf);
        if (mode == 0x66) {
          if (pcVar28 == (char *)0x0) {
            iVar12 = 0;
            goto LAB_001ef76b;
          }
          strcpy(targetDir,pcVar28);
          sVar17 = strlen(targetDir);
          (targetDir + sVar17)[0] = '/';
          (targetDir + sVar17)[1] = '\0';
          strcat(targetDir,pcVar42);
          if (verbose != '\0') {
            fprintf(_stdout,"# Install: Files mode, copying files to %s..\n",targetDir);
          }
          pcVar42 = local_62b8->str;
          memset(dirBuf,0,0x200);
          UVar9 = T_FileStream_file_exists(targetDir);
          if (UVar9 == '\0') {
            _status_1 = (char *)((ulong)_status_1 & 0xffffffff00000000);
            uprv_mkdir(targetDir,&status_1);
            if (U_ZERO_ERROR < status_1) {
              pcVar28 = targetDir;
LAB_001efa18:
              fprintf(_stderr,"Error creating installation directory: %s\n",pcVar28);
              iVar12 = -1;
              goto LAB_001ef76b;
            }
          }
          memset(&status_1,0,0x200);
          pFVar19 = T_FileStream_open(pcVar42,"r");
          if (pFVar19 == (FileStream *)0x0) {
            fprintf(_stderr,"Unable to open list file: %s\n",pcVar42);
            iVar12 = -1;
          }
          else {
            do {
              pcVar23 = T_FileStream_readLine(pFVar19,(char *)&status_1,0x200);
              if (pcVar23 == (char *)0x0) {
                iVar13 = T_FileStream_eof(pFVar19);
                iVar12 = 0;
                if (iVar13 == 0) {
                  fprintf(_stderr,"Failed to read line from file: %s\n",pcVar42);
                  iVar12 = -1;
                }
                goto LAB_001ee9c0;
              }
              sVar17 = strlen((char *)&status_1);
              if (0 < (int)sVar17) {
                *(undefined1 *)((long)&status_1 + (ulong)((int)sVar17 - 1)) = 0;
              }
              UVar9 = -0x70;
              sprintf(dirBuf,"%s %s%s%s %s%s%s",pkgDataFlags[0x10],sourcePath,"/",&status_1,
                      targetDir,"/",&status_1);
              iVar12 = runCommand(dirBuf,UVar9);
            } while (iVar12 == 0);
            fprintf(_stderr,"Failed to install data file with command: %s\n",dirBuf);
LAB_001ee9c0:
            T_FileStream_close(pFVar19);
          }
        }
        else {
          strcpy(targetDir,pcVar32);
          sVar17 = strlen(targetDir);
          (targetDir + sVar17)[0] = '/';
          (targetDir + sVar17)[1] = '\0';
          strcpy(tmpDir,__src);
          sVar17 = strlen(tmpDir);
          (tmpDir + sVar17)[0] = '/';
          (tmpDir + sVar17)[1] = '\0';
          strcpy((char *)&cmdBuf,tmpDir);
          strcpy(datFileName,pcVar42);
          sVar17 = strlen(datFileName);
          builtin_strncpy(datFileName + sVar17,".dat",5);
          strcat((char *)&cmdBuf,datFileName);
          if (verbose != '\0') {
            fprintf(_stdout,"# Writing package file %s ..\n",&cmdBuf);
          }
          iVar12 = writePackageDatFile((char *)&cmdBuf,pcVar18,sourcePath,local_62b8->str,
                                       (Package *)0x0,'l');
          if (iVar12 != 0) {
            fwrite("Error writing package dat file.\n",0x20,1,_stderr);
            goto LAB_001ef76b;
          }
          if ((mode & 0xfd) != 0x61) {
            memset(gencFilePath,0,0x200);
            version_major[8] = '\0';
            version_major[9] = '\0';
            version_major[0] = '\0';
            version_major[1] = '\0';
            version_major[2] = '\0';
            version_major[3] = '\0';
            version_major[4] = '\0';
            version_major[5] = '\0';
            version_major[6] = '\0';
            version_major[7] = '\0';
            if (pcVar34 == (char *)0x0) {
              local_62ec = '\x01';
              if ((mode & 0xf7) == 100) {
                fwrite("Warning: Providing a revision number with the -r option is recommended when packaging data in the current mode.\n"
                       ,0x70,1,_stdout);
              }
              pUVar39 = (UErrorCode *)0x0;
            }
            else {
              for (lVar31 = 0; lVar31 != 10; lVar31 = lVar31 + 1) {
                if (pcVar34[lVar31] == '.') {
                  version_major[lVar31] = '\0';
                  break;
                }
                version_major[lVar31] = pcVar34[lVar31];
              }
              local_62ec = '\0';
            }
            ppcVar38 = pkgDataFlags;
            pcVar23 = pkgDataFlags[5];
            sVar17 = strlen(pcVar23);
            cVar26 = pcVar23[sVar17 - 1];
            pcVar32 = ppcVar38[1];
            sVar17 = strlen(pcVar32);
            if (pUVar39 == (UErrorCode *)0x0) {
              pUVar39 = (UErrorCode *)0x30b2d1;
            }
            cVar8 = pcVar32[sVar17 - 1];
            pcVar30 = ".";
            if (*pcVar32 == '\0') {
              pcVar30 = "";
            }
            pcVar32 = "";
            if (*pcVar23 == '.') {
              pcVar32 = ".";
            }
            sprintf(libFileNames[0],"%s%s",ppcVar38[4],pcVar40);
            if (verbose != '\0') {
              fprintf(_stdout,"# libFileName[LIB_FILE] = %s\n",libFileNames);
            }
            pUVar35 = (UErrorCode *)pkgDataFlags[2];
            if ((pcVar34 == (char *)0x0) && (cVar26 != cVar8)) {
              sprintf(libFileNames[3],"%s%s%s",libFileNames,pcVar32,pUVar35);
              sprintf(libFileNames[1],"%s%s%s",libFileNames,pcVar32,pkgDataFlags[1]);
              pUVar35 = (UErrorCode *)pkgDataFlags[1];
              sprintf(libFileNames[2],"%s%s%s",libFileNames,pcVar32);
            }
            else {
              pUVar36 = pUVar35;
              pUVar1 = pUVar39;
              if (cVar26 != cVar8) {
                pUVar36 = pUVar39;
                pUVar1 = pUVar35;
              }
              sprintf(libFileNames[3],"%s%s%s%s%s",libFileNames,pcVar32,pUVar1,pcVar30,pUVar36);
              if (cVar26 == cVar8) {
                sprintf(libFileNames[1],"%s%s%s%s%s",libFileNames,pcVar32,version_major,pcVar30,
                        pkgDataFlags[1]);
                pUVar35 = pUVar39;
                pUVar39 = (UErrorCode *)pkgDataFlags[1];
              }
              else {
                sprintf(libFileNames[1],"%s%s%s%s%s",libFileNames,pcVar32,pkgDataFlags[1],pcVar30,
                        version_major);
                pUVar35 = (UErrorCode *)pkgDataFlags[1];
              }
              sprintf(libFileNames[2],"%s%s%s%s%s",libFileNames,pcVar32,pUVar35,pcVar30,pUVar39);
            }
            if (verbose != '\0') {
              fprintf(_stdout,"# libFileName[LIB_FILE_VERSION] = %s\n",0x3f3d40);
            }
            if (mode == 0x73) {
              sprintf(libFileNames[2],"%s.%s",libFileNames);
              libFileNames[1][0] = '\0';
              if (verbose != '\0') {
                fprintf(_stdout,"# libFileName[LIB_FILE_VERSION] = %s  (static)\n",0x3f3d40);
              }
              if (cVar2 != '\0') goto LAB_001eee4f;
LAB_001eed51:
              sprintf(cmd,"%s%s",targetDir,0x3f3d40);
              UVar9 = T_FileStream_file_exists(cmd);
              if (UVar9 == '\0') {
                if (pcVar28 != (char *)0x0 && verbose != '\0') {
                  pcVar23 = "# Not installing missing %s into %s\n";
LAB_001eee33:
                  fprintf(_stdout,pcVar23,cmd);
                }
                goto LAB_001eee4f;
              }
              UVar9 = isFileModTimeLater(cmd,sourcePath,'\x01');
              if ((UVar9 == '\0') || (UVar9 = isFileModTimeLater(cmd,pcVar43,'\0'), UVar9 == '\0'))
              {
                if (pcVar28 != (char *)0x0 && verbose != '\0') {
                  pcVar23 = "# Not installing up-to-date library %s into %s\n";
                  goto LAB_001eee33;
                }
                goto LAB_001eee4f;
              }
              if (pcVar28 != (char *)0x0) {
                if (verbose != '\0') {
                  fprintf(_stdout,"# Installing already-built library into %s\n",pcVar28);
                }
LAB_001ef3b7:
                iVar12 = pkg_installLibrary(pcVar28,targetDir,local_62ec);
                goto LAB_001ef76b;
              }
              if (verbose != '\0') {
                printf("# Not rebuilding %s - up to date.\n",cmd);
                iVar12 = 0;
                goto LAB_001ef76b;
              }
LAB_001ef763:
              iVar12 = 0;
            }
            else {
              if (pcVar34 != (char *)0x0 && cVar2 == '\0') goto LAB_001eed51;
LAB_001eee4f:
              if ((cVar7 == '\0') && (pcVar23 = *pkgDataFlags, *pcVar23 != '\0')) {
                if (verbose != '\0') {
                  fprintf(_stdout,"# Generating assembly code %s of type %s ..\n",gencFilePath);
                }
                sVar17 = strlen(pcVar23);
                if ((sVar17 < 4) || (UVar9 = checkAssemblyHeaderName(pcVar23 + 3), UVar9 == '\0')) {
                  fprintf(_stderr,"Assembly type \"%s\" is unknown.\n",pcVar23);
                  iVar12 = -1;
                  goto LAB_001ef76b;
                }
                writeAssemblyCode((char *)&cmdBuf,__src,optEntryPoint,(char *)0x0,gencFilePath);
                memset(dirBuf,0,0x200);
                strcpy(dirBuf,gencFilePath);
                sVar17 = strlen(dirBuf);
                ppcVar38 = pkgDataFlags;
                dirBuf[sVar17 - 1] = 'o';
                sVar17 = strlen(pkgDataFlags[6]);
                sVar22 = strlen(ppcVar38[7]);
                sVar24 = strlen(dirBuf);
                sVar25 = strlen(gencFilePath);
                pcVar42 = (char *)uprv_malloc_63((long)((int)sVar25 +
                                                        (int)sVar24 + (int)sVar22 + (int)sVar17 +
                                                       0x14));
                if (pcVar42 == (char *)0x0) {
                  iVar12 = -1;
                }
                else {
                  UVar9 = -9;
                  pcVar23 = dirBuf;
                  sprintf(pcVar42,"%s %s -o %s %s",pkgDataFlags[6],pkgDataFlags[7],pcVar23,
                          gencFilePath);
                  UVar33 = (UBool)pcVar23;
                  iVar12 = runCommand(pcVar42,UVar9);
                  uprv_free_63(pcVar42);
                  if (iVar12 == 0) {
                    iVar12 = pkg_generateLibraryFile(targetDir,mode,dirBuf,(char *)0x0,UVar33);
                    if (iVar12 == 0) {
                      if (mode == 0x73) {
                        if (pcVar28 == (char *)0x0) {
                          iVar12 = 0;
                          goto LAB_001ef76b;
                        }
                        if (verbose != '\0') {
                          fprintf(_stdout,"# Installing static library into %s\n",pcVar28);
                        }
                        goto LAB_001ef3b7;
                      }
                      goto LAB_001ef546;
                    }
                  }
                  else {
                    fprintf(_stderr,"Error creating with assembly code. Failed command: %s\n",
                            pcVar42);
                  }
                }
                pcVar42 = "Error generating assembly code for data.\n";
                sVar17 = 0x29;
LAB_001efae8:
                fwrite(pcVar42,sVar17,1,_stderr);
                goto LAB_001ef76b;
              }
              if (verbose != '\0') {
                fprintf(_stdout,"# Writing object code to %s ..\n",gencFilePath);
              }
              if (cVar7 == '\0') {
                local_6030 = local_6030 & 0xffff0000;
                _status_1 = (char *)0x0;
                pFVar19 = T_FileStream_open("oma.c","w");
                if (pFVar19 == (FileStream *)0x0) {
                  pUVar39 = (UErrorCode *)0x0;
                  fprintf(_stderr,"T_FileStream_open failed to open %s for writing\n","oma.c");
                }
                else {
                  T_FileStream_writeLine(pFVar19,"void oma(){}");
                  T_FileStream_close(pFVar19);
                  UVar9 = -3;
                  sprintf(dirBuf,"%s %s -o %s",pkgDataFlags[6],"oma.c");
                  iVar12 = runCommand(dirBuf,UVar9);
                  if (iVar12 == 0) {
                    _status_1 = (char *)0x6a626f2e616d6f;
                  }
                  else {
                    fprintf(_stderr,"Failed to compile %s\n","oma.c");
                  }
                  UVar9 = T_FileStream_remove("oma.c");
                  if (UVar9 == '\0') {
                    fprintf(_stderr,"T_FileStream_remove failed to delete %s\n","oma.c");
                  }
                  pUVar39 = &status_1;
                  if (iVar12 != 0) {
                    pUVar39 = (UErrorCode *)0x0;
                  }
                }
                UVar33 = '\0';
                writeObjectCode((char *)&cmdBuf,__src,optEntryPoint,(char *)pUVar39,(char *)0x0,
                                gencFilePath);
                UVar9 = T_FileStream_file_exists((char *)&status_1);
                if ((UVar9 != '\0') &&
                   (UVar9 = T_FileStream_remove((char *)&status_1), UVar9 == '\0')) {
                  fprintf(_stderr,"T_FileStream_remove failed to delete %s\n",&status_1);
                }
                iVar12 = pkg_generateLibraryFile(targetDir,mode,gencFilePath,(char *)0x0,UVar33);
              }
              else {
                iVar12 = -1;
                uVar15 = pkg_countCharList(l);
                memset(dirBuf,0,0x200);
                memset(&status_1,0,0x200);
                if ((l != (CharList *)0x0) && (local_62a8 != (CharList *)0x0)) {
                  pcVar23 = (char *)uprv_malloc_63((long)(int)(uVar15 * 0x200 + 0x400));
                  if (pcVar23 == (char *)0x0) {
                    fwrite("Unable to allocate memory for cmd.\n",0x23,1,_stderr);
                  }
                  else {
                    pcVar40 = (char *)uprv_malloc_63((long)(int)(uVar15 * 0x200 + 0x200));
                    if (pcVar40 == (char *)0x0) {
                      fwrite("Unable to allocate memory for buffer.\n",0x26,1,_stderr);
                      uprv_free_63(pcVar23);
                    }
                    else {
                      iVar13 = 0;
                      local_62e0 = local_62a8;
                      local_62c8 = l;
LAB_001eef70:
                      if (iVar13 <= (int)uVar15) {
                        if (iVar13 != 0) {
                          pcVar43 = local_62c8->str;
                          pcVar32 = local_62e0->str;
                          dataName[0] = '\0';
                          newName._0_4_ = newName._0_4_ & 0xffffff00;
                          lVar31 = 0;
LAB_001eefb1:
                          if (lVar31 != 9) {
                            p.super_LocalPointerBase<_IO_FILE>.ptr =
                                 (LocalPointerBase<_IO_FILE>)
                                 ((ulong)p.super_LocalPointerBase<_IO_FILE>.ptr & 0xffffffffffffff00
                                 );
                            pacVar45 = DATA_PREFIX + lVar31;
                            sprintf((char *)&p,"%s%s",pacVar45);
                            pcVar30 = strstr(pcVar32,(char *)&p);
                            if (pcVar30 != (char *)0x0) {
                              memset(&status,0,0x200);
                              sVar17 = strlen((char *)&p);
                              lVar29 = 0;
                              do {
                                if (pcVar32[lVar29 + sVar17] == '.') {
                                  *(undefined1 *)((long)&status + lVar29) = 0x5f;
                                }
                                else {
                                  *(char *)((long)&status + lVar29) = pcVar32[lVar29 + sVar17];
                                  if (pcVar32[lVar29 + sVar17] == '\0') goto LAB_001ef03c;
                                }
                                lVar29 = lVar29 + 1;
                              } while( true );
                            }
                            goto LAB_001ef071;
                          }
                          cVar10 = '\0';
                          goto LAB_001ef0dd;
                        }
                        createCommonDataFile
                                  (__src,pcVar42,optEntryPoint,(char *)0x0,sourcePath,pcVar18,
                                   local_62b8->str,0,'\x01',verbose,dirBuf);
                        *pcVar40 = '\0';
                        goto LAB_001ef145;
                      }
                      iVar12 = pkg_generateLibraryFile
                                         (targetDir,mode,pcVar40,pcVar23,(UBool)pUVar35);
LAB_001ef519:
                      uprv_free_63(pcVar40);
                      uprv_free_63(pcVar23);
                    }
                  }
                }
              }
              if (iVar12 == 0) {
                if (mode == 0x73) {
LAB_001ef715:
                  if (pcVar28 != (char *)0x0) {
                    if (verbose != '\0') {
                      fprintf(_stdout,"# Installing library file to %s ..\n",pcVar28);
                    }
                    iVar12 = pkg_installLibrary(pcVar28,targetDir,local_62ec);
                    if (iVar12 != 0) {
                      pcVar42 = "Error installing the data library.\n";
                      sVar17 = 0x23;
                      goto LAB_001efae8;
                    }
                  }
                  goto LAB_001ef763;
                }
LAB_001ef546:
                if (verbose != '\0') {
                  fwrite("# Creating data archive library file ..\n",0x28,1,_stdout);
                }
                ppcVar38 = pkgDataFlags;
                pcVar42 = pkgDataFlags[1];
                iVar12 = strcmp(pkgDataFlags[2],pcVar42);
                if ((iVar12 == 0) || (iVar12 = strcmp(ppcVar38[3],pcVar42), iVar12 != 0)) {
                  UVar9 = '@';
                  strcpy(libFileNames[2],libFileNames[3]);
LAB_001ef6fb:
                  if ((pcVar34 == (char *)0x0) ||
                     (iVar12 = pkg_createSymLinks(targetDir,UVar9), iVar12 == 0)) goto LAB_001ef715;
                  pcVar42 = "Error creating symbolic links of the data library file.\n";
                  sVar17 = 0x38;
                }
                else {
                  pcVar23 = "";
                  if (*ppcVar38[5] == '.') {
                    pcVar23 = ".";
                  }
                  pcVar43 = pcVar42;
                  pcVar40 = pcVar34;
                  if (cVar26 != cVar8) {
                    pcVar43 = pcVar34;
                    pcVar40 = pcVar42;
                  }
                  sprintf(libFileNames[2],"%s%s%s.%s",libFileNames,pcVar23,pcVar40,pcVar43);
                  UVar9 = '\b';
                  sprintf(dirBuf,"%s %s %s%s %s%s",pkgDataFlags[0xd],pkgDataFlags[0xe],targetDir,
                          0x3f3d40,targetDir,0x3f3e40);
                  iVar12 = runCommand(dirBuf,UVar9);
                  if (iVar12 == 0) {
                    UVar9 = '\x10';
                    sprintf(dirBuf,"%s %s%s",pkgDataFlags[0xf],targetDir,0x3f3d40);
                    iVar12 = runCommand(dirBuf,UVar9);
                    if (iVar12 == 0) {
                      UVar9 = '\x10';
                      sprintf(dirBuf,"%s %s%s","rm -f",targetDir,0x3f3e40);
                      iVar12 = runCommand(dirBuf,UVar9);
                      if (iVar12 == 0) goto LAB_001ef6fb;
                    }
                  }
                  fprintf(_stderr,"Error creating archive library. Failed command: %s\n",dirBuf);
                  pcVar42 = "Error creating data archive library file.\n";
                  sVar17 = 0x2a;
                }
              }
              else {
                pcVar42 = "Error generating package data.\n";
                sVar17 = 0x1f;
              }
              fwrite(pcVar42,sVar17,1,_stderr);
            }
            goto LAB_001ef76b;
          }
          memset(dirBuf,0,0x800);
          strcpy(dirBuf,targetDir);
          strcat(dirBuf,datFileName);
          iVar12 = strcmp((char *)&cmdBuf,dirBuf);
          if (iVar12 == 0) {
LAB_001ee8f6:
            iVar12 = 0;
            if (pcVar28 == (char *)0x0) goto LAB_001ef76b;
            memset(&status_1,0,0x200);
            UVar9 = T_FileStream_file_exists(pcVar28);
            if (UVar9 == '\0') {
              newName[0] = '\0';
              newName[1] = '\0';
              newName[2] = '\0';
              newName[3] = '\0';
              uprv_mkdir(pcVar28,(UErrorCode *)newName);
              if (0 < (int)newName._0_4_) goto LAB_001efa18;
            }
            UVar9 = 'd';
            sprintf((char *)&status_1,"%s %s %s",pkgDataFlags[0x10],dirBuf,pcVar28);
            iVar13 = runCommand((char *)&status_1,UVar9);
            iVar12 = 0;
            if (iVar13 == 0) goto LAB_001ef76b;
            pcVar42 = "Failed to install data file with command: %s\n";
            pUVar39 = &status_1;
          }
          else {
            UVar9 = T_FileStream_file_exists(dirBuf);
            if ((UVar9 == '\0') || (iVar13 = remove(dirBuf), iVar13 == 0)) {
              iVar12 = rename((char *)&cmdBuf,dirBuf);
              if (verbose != '\0') {
                fprintf(_stdout,"# Moving package file to %s ..\n",dirBuf);
              }
              if (iVar12 != 0) {
                fprintf(_stderr,"Unable to move dat file (%s) to target location (%s).\n",&cmdBuf,
                        dirBuf);
                goto LAB_001ef76b;
              }
              goto LAB_001ee8f6;
            }
            pcVar42 = "Unable to remove old dat file: %s\n";
            pUVar39 = (UErrorCode *)dirBuf;
          }
          fprintf(_stderr,pcVar42,pUVar39);
          iVar12 = iVar13;
        }
LAB_001ef76b:
        if (pkgDataFlags != (char **)0x0) {
          for (lVar31 = 0; lVar31 != 0x11; lVar31 = lVar31 + 1) {
            if (pkgDataFlags[lVar31] != (char *)0x0) {
              uprv_free_63(pkgDataFlags[lVar31]);
            }
          }
          uprv_free_63(pkgDataFlags);
        }
        if (buffer != (char *)0x0) {
          uprv_free_63(buffer);
        }
        if (local_62b8 != (CharList *)0x0) {
          pkg_deleteList(local_62b8);
        }
        if (l != (CharList *)0x0) {
          pkg_deleteList(l);
        }
        if (local_62a8 == (CharList *)0x0) {
          return iVar12;
        }
        pkg_deleteList(local_62a8);
        return iVar12;
      }
      pcVar42 = " required parameter -p is missing \n";
      sVar17 = 0x23;
    }
    fwrite(pcVar42,sVar17,1,_stderr);
  }
  pcVar42 = "Run \'%s --help\' for help.\n";
LAB_001ee53d:
  fprintf(_stderr,pcVar42,progname);
  return 1;
code_r0x001ee14d:
  *pcVar23 = '\0';
  uVar37 = uVar37 + 1;
  goto LAB_001ee12b;
LAB_001ef03c:
  sprintf(newName,"%s_%s",pacVar45,&status);
  sprintf(dataName,"%s_%s",pcVar42,pacVar45);
LAB_001ef071:
  lVar31 = lVar31 + 1;
  cVar10 = newName[0];
  if (newName[0] != '\0') goto LAB_001ef0dd;
  goto LAB_001eefb1;
LAB_001ef0dd:
  if (verbose != '\0') {
    printf("# Generating %s \n",dirBuf);
    cVar10 = newName[0];
  }
  pcVar32 = dataName;
  if (dataName[0] == '\0') {
    pcVar32 = pcVar42;
  }
  pcVar30 = newName;
  if (cVar10 == '\0') {
    pcVar30 = (char *)0x0;
  }
  writeCCode(pcVar43,__src,pcVar32,pcVar30,dirBuf);
LAB_001ef145:
  strcpy((char *)&status_1,dirBuf);
  sVar17 = strlen((char *)&status_1);
  *(char *)((sVar17 - 1) + (long)&status_1) = 'o';
  UVar9 = -9;
  pUVar35 = &status_1;
  sprintf(pcVar23,"%s %s -o %s %s",pkgDataFlags[6],pkgDataFlags[7],&status_1,dirBuf);
  iVar12 = runCommand(pcVar23,UVar9);
  if (iVar12 != 0) {
    fprintf(_stderr,"Error creating library without assembly code. Failed command: %s\n",pcVar23);
    goto LAB_001ef519;
  }
  sVar17 = strlen(pcVar40);
  (pcVar40 + sVar17)[0] = ' ';
  (pcVar40 + sVar17)[1] = '\0';
  strcat(pcVar40,(char *)&status_1);
  if (iVar13 != 0) {
    local_62c8 = local_62c8->next;
    local_62e0 = local_62e0->next;
  }
  iVar13 = iVar13 + 1;
  goto LAB_001eef70;
}

Assistant:

int
main(int argc, char* argv[]) {
    int result = 0;
    /* FileStream  *out; */
    UPKGOptions  o;
    CharList    *tail;
    UBool        needsHelp = FALSE;
    UErrorCode   status = U_ZERO_ERROR;
    /* char         tmp[1024]; */
    uint32_t i;
    int32_t n;

    U_MAIN_INIT_ARGS(argc, argv);

    progname = argv[0];

    options[MODE].value = "common";

    /* read command line options */
    argc=u_parseArgs(argc, argv, UPRV_LENGTHOF(options), options);

    /* error handling, printing usage message */
    /* I've decided to simply print an error and quit. This tool has too
    many options to just display them all of the time. */

    if(options[HELP].doesOccur || options[HELP_QUESTION_MARK].doesOccur) {
        needsHelp = TRUE;
    }
    else {
        if(!needsHelp && argc<0) {
            fprintf(stderr,
                "%s: error in command line argument \"%s\"\n",
                progname,
                argv[-argc]);
            fprintf(stderr, "Run '%s --help' for help.\n", progname);
            return 1;
        }


#if !defined(WINDOWS_WITH_MSVC) || defined(USING_CYGWIN)
        if(!options[BLDOPT].doesOccur && uprv_strcmp(options[MODE].value, "common") != 0) {
          if (pkg_getOptionsFromICUConfig(options[VERBOSE].doesOccur, &options[BLDOPT]) != 0) {
                fprintf(stderr, " required parameter is missing: -O is required for static and shared builds.\n");
                fprintf(stderr, "Run '%s --help' for help.\n", progname);
                return 1;
            }
        }
#else
        if(options[BLDOPT].doesOccur) {
            fprintf(stdout, "Warning: You are using the -O option which is not needed for MSVC build on Windows.\n");
        }
#endif

        if(!options[NAME].doesOccur) /* -O we already have - don't report it. */
        {
            fprintf(stderr, " required parameter -p is missing \n");
            fprintf(stderr, "Run '%s --help' for help.\n", progname);
            return 1;
        }

        if(argc == 1) {
            fprintf(stderr,
                "No input files specified.\n"
                "Run '%s --help' for help.\n", progname);
            return 1;
        }
    }   /* end !needsHelp */

    if(argc<0 || needsHelp  ) {
        fprintf(stderr,
            "usage: %s [-options] [-] [packageFile] \n"
            "\tProduce packaged ICU data from the given list(s) of files.\n"
            "\t'-' by itself means to read from stdin.\n"
            "\tpackageFile is a text file containing the list of files to package.\n",
            progname);

        fprintf(stderr, "\n options:\n");
        for(i=0;i<UPRV_LENGTHOF(options);i++) {
            fprintf(stderr, "%-5s -%c %s%-10s  %s\n",
                (i<1?"[REQ]":""),
                options[i].shortName,
                options[i].longName ? "or --" : "     ",
                options[i].longName ? options[i].longName : "",
                options_help[i]);
        }

        fprintf(stderr, "modes: (-m option)\n");
        for(i=0;i<UPRV_LENGTHOF(modes);i++) {
            fprintf(stderr, "   %-9s ", modes[i].name);
            if (modes[i].alt_name) {
                fprintf(stderr, "/ %-9s", modes[i].alt_name);
            } else {
                fprintf(stderr, "           ");
            }
            fprintf(stderr, "  %s\n", modes[i].desc);
        }
        return 1;
    }

    /* OK, fill in the options struct */
    uprv_memset(&o, 0, sizeof(o));

    o.mode      = options[MODE].value;
    o.version   = options[REVISION].doesOccur ? options[REVISION].value : 0;

    o.shortName = options[NAME].value;
    {
        int32_t len = (int32_t)uprv_strlen(o.shortName);
        char *csname, *cp;
        const char *sp;

        cp = csname = (char *) uprv_malloc((len + 1 + 1) * sizeof(*o.cShortName));
        if (*(sp = o.shortName)) {
            *cp++ = isalpha(*sp) ? * sp : '_';
            for (++sp; *sp; ++sp) {
                *cp++ = isalnum(*sp) ? *sp : '_';
            }
        }
        *cp = 0;

        o.cShortName = csname;
    }

    if(options[LIBNAME].doesOccur) { /* get libname from shortname, or explicit -L parameter */
      o.libName = options[LIBNAME].value;
    } else {
      o.libName = o.shortName;
    }

    if(options[QUIET].doesOccur) {
      o.quiet = TRUE;
    } else {
      o.quiet = FALSE;
    }

    if(options[PDS_BUILD].doesOccur) {
#if U_PLATFORM == U_PF_OS390
      o.pdsbuild = TRUE;
#else
      o.pdsbuild = FALSE;
      fprintf(stdout, "Warning: You are using the -z option which only works on z/OS.\n");

#endif
    } else {
      o.pdsbuild = FALSE;
    }

    o.verbose   = options[VERBOSE].doesOccur;


#if !defined(WINDOWS_WITH_MSVC) || defined(USING_CYGWIN) /* on UNIX, we'll just include the file... */
    if (options[BLDOPT].doesOccur) {
        o.options   = options[BLDOPT].value;
    } else {
        o.options = NULL;
    }
#endif
    if(options[COPYRIGHT].doesOccur) {
        o.comment = U_COPYRIGHT_STRING;
    } else if (options[COMMENT].doesOccur) {
        o.comment = options[COMMENT].value;
    }

    if( options[DESTDIR].doesOccur ) {
        o.targetDir = options[DESTDIR].value;
    } else {
        o.targetDir = ".";  /* cwd */
    }

    o.rebuild   = options[REBUILD].doesOccur;

    if( options[TEMPDIR].doesOccur ) {
        o.tmpDir    = options[TEMPDIR].value;
    } else {
        o.tmpDir    = o.targetDir;
    }

    if( options[INSTALL].doesOccur ) {
        o.install  = options[INSTALL].value;
    } else {
        o.install = NULL;
    }

    if( options[SOURCEDIR].doesOccur ) {
        o.srcDir   = options[SOURCEDIR].value;
    } else {
        o.srcDir   = ".";
    }

    if( options[ENTRYPOINT].doesOccur ) {
        o.entryName = options[ENTRYPOINT].value;
    } else {
        o.entryName = o.cShortName;
    }

    o.withoutAssembly = FALSE;
    if (options[WITHOUT_ASSEMBLY].doesOccur) {
#ifndef BUILD_DATA_WITHOUT_ASSEMBLY
        fprintf(stdout, "Warning: You are using the option to build without assembly code which is not supported on this platform.\n");
        fprintf(stdout, "Warning: This option will be ignored.\n");
#else
        o.withoutAssembly = TRUE;
#endif
    }

    /* OK options are set up. Now the file lists. */
    tail = NULL;
    for( n=1; n<argc; n++) {
        o.fileListFiles = pkg_appendToList(o.fileListFiles, &tail, uprv_strdup(argv[n]));
    }

    /* load the files */
    loadLists(&o, &status);
    if( U_FAILURE(status) ) {
        fprintf(stderr, "error loading input file lists: %s\n", u_errorName(status));
        return 2;
    }

    result = pkg_executeOptions(&o);

    if (pkgDataFlags != NULL) {
        for (n = 0; n < PKGDATA_FLAGS_SIZE; n++) {
            if (pkgDataFlags[n] != NULL) {
                uprv_free(pkgDataFlags[n]);
            }
        }
        uprv_free(pkgDataFlags);
    }

    if (o.cShortName != NULL) {
        uprv_free((char *)o.cShortName);
    }
    if (o.fileListFiles != NULL) {
        pkg_deleteList(o.fileListFiles);
    }
    if (o.filePaths != NULL) {
        pkg_deleteList(o.filePaths);
    }
    if (o.files != NULL) {
        pkg_deleteList(o.files);
    }

    return result;
}